

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O0

string * __thiscall FSAOHDist_NECOF::SoftPrint_abi_cxx11_(FSAOHDist_NECOF *this)

{
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference ppCVar4;
  long in_RSI;
  string *in_RDI;
  Index agI;
  stringstream ss;
  ostream *in_stack_fffffffffffffd78;
  string local_210 [36];
  uint local_1ec;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [240];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff68;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Nearly completely factored (S,OH)-distribution:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"state factor marginals=");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  (**(code **)(**(long **)(in_RSI + 0x18) + 0x30))(local_1c8);
  poVar1 = std::operator<<(local_188,local_1c8);
  poVar1 = std::operator<<(poVar1,"oHist marginals=");
  PrintTools::SoftPrintVector<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffff68)
  ;
  poVar1 = std::operator<<(poVar1,local_1e8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c8);
  poVar1 = std::operator<<(local_188,"oHist conditionals=");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1ec = 0;
  while( true ) {
    uVar2 = (ulong)local_1ec;
    sVar3 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::size
                      ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                       (in_RSI + 0x20));
    if (sVar3 <= uVar2) break;
    poVar1 = local_188;
    ppCVar4 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                         poVar1,(size_type)in_stack_fffffffffffffd78);
    (*(*ppCVar4)->_vptr_CPDDiscreteInterface[7])(local_210);
    in_stack_fffffffffffffd78 = std::operator<<(poVar1,local_210);
    std::ostream::operator<<(in_stack_fffffffffffffd78,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_210);
    local_1ec = local_1ec + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string FSAOHDist_NECOF::SoftPrint() const
{
    stringstream ss;
    ss << "Nearly completely factored (S,OH)-distribution:"<<endl
        << "state factor marginals="<<endl;
    ss << _m_sfacMarginals->SoftPrint() 
       << "oHist marginals="<< SoftPrintVector(_m_oHistMarginals) << endl;
    ss << "oHist conditionals=" << endl;
//     <<     "Not printed"<< endl <<
    for(Index agI=0; agI < _m_oHistConditional.size(); agI++)        
        ss <<  _m_oHistConditional.at(agI)->SoftPrint() << endl;
    return (ss.str() );

}